

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

void Of_ManComputeForwardDircon1(Of_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  Of_Obj_t *pOVar2;
  Gia_Man_t *pGVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  pGVar3 = p->pGia;
  if (0 < pGVar3->nObjs) {
    lVar8 = 8;
    lVar6 = 0;
    lVar5 = 0;
    lVar7 = 0;
    do {
      pGVar1 = pGVar3->pObjs;
      if (pGVar1 == (Gia_Obj_t *)0x0) {
        return;
      }
      uVar4 = (uint)*(undefined8 *)(&pGVar1->field_0x0 + lVar6);
      if ((~uVar4 & 0x1fffffff) != 0 && -1 < (int)uVar4) {
        if ((((int)uVar4 < 0) || ((uVar4 & 0x1fffffff) == 0x1fffffff)) ||
           ((uVar4 & 0x1fffffff) !=
            ((uint)((ulong)*(undefined8 *)(&pGVar1->field_0x0 + lVar6) >> 0x20) & 0x1fffffff))) {
          Of_ManComputeForwardDirconObj(p,(int)lVar7);
        }
        else {
          pOVar2 = p->pObjs;
          *(undefined4 *)((long)&pOVar2->iCutH + lVar8) =
               *(undefined4 *)((long)&pOVar2[-(ulong)(uVar4 & 0x1fffffff)].iCutH + lVar8);
          *(undefined4 *)((long)&pOVar2->iCutH2 + lVar8) =
               *(undefined4 *)
                ((long)&pOVar2->Delay2 +
                ((long)(lVar5 - ((ulong)(*(uint *)(&pGVar1->field_0x0 + lVar6) & 0x1fffffff) << 0x20
                                )) >> 0x1b));
        }
      }
      lVar7 = lVar7 + 1;
      pGVar3 = p->pGia;
      lVar5 = lVar5 + 0x100000000;
      lVar6 = lVar6 + 0xc;
      lVar8 = lVar8 + 0x20;
    } while (lVar7 < pGVar3->nObjs);
  }
  return;
}

Assistant:

void Of_ManComputeForwardDircon1( Of_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
        {
            Of_ObjSetDelay1( p, i, Of_ObjDelay1(p, Gia_ObjFaninId0(pObj, i)) );
            Of_ObjSetDelay2( p, i, Of_ObjDelay2(p, Gia_ObjFaninId0(pObj, i)) );
        }
        else
            Of_ManComputeForwardDirconObj( p, i );
}